

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceStringsWrapper.h
# Opt level: O0

QString * __thiscall ResString::getQString(QString *__return_storage_ptr__,ResString *this)

{
  Executable *pEVar1;
  int iVar2;
  undefined4 extraout_var;
  WORD *content;
  int size;
  WORD *entries;
  ResString *this_local;
  
  if ((this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe == (Executable *)0x0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
    iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                      (pEVar1,this->offset,1,(long)(int)(uint)*this->sizePtr,0);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      QString::QString(__return_storage_ptr__,"");
    }
    else {
      QString::fromUtf16((wchar16 *)__return_storage_ptr__,CONCAT44(extraout_var,iVar2));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString getQString()
    {
        if (this->m_Exe == NULL) return ""; //ERROR
        WORD* entries = ptr;
        int size = *(sizePtr);
        WORD *content = (WORD*) this->m_Exe->getContentAt(offset,Executable::RAW, size);
        if (content == NULL) return "";

        return QString::fromUtf16(reinterpret_cast<const char16_t*>(content), size);
    }